

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::ClearBuildBuffers(RTCPCompoundPacketBuilder *this)

{
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *this_00;
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *this_01;
  RTPMemoryManager *extraout_RDX;
  RTPMemoryManager *extraout_RDX_00;
  RTPMemoryManager *mgr;
  RTPMemoryManager *extraout_RDX_01;
  _List_node_base *p_Var1;
  
  Report::Clear(&this->report);
  SDES::Clear(&this->sdes);
  this_00 = &this->byepackets;
  mgr = extraout_RDX;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if ((jrtplib *)p_Var1[1]._M_next != (jrtplib *)0x0) {
      RTPDeleteByteArray((jrtplib *)p_Var1[1]._M_next,
                         (uint8_t *)(this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,mgr);
      mgr = extraout_RDX_00;
    }
  }
  this_01 = &this->apppackets;
  p_Var1 = (_List_node_base *)this_01;
  while (p_Var1 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_01) {
    if ((jrtplib *)p_Var1[1]._M_next != (jrtplib *)0x0) {
      RTPDeleteByteArray((jrtplib *)p_Var1[1]._M_next,
                         (uint8_t *)(this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,mgr);
      mgr = extraout_RDX_01;
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(this_00);
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(this_01);
  this->byesize = 0;
  this->appsize = 0;
  return;
}

Assistant:

void RTCPCompoundPacketBuilder::ClearBuildBuffers()
{
	report.Clear();
	sdes.Clear();

	std::list<Buffer>::const_iterator it;
	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
	for (it = apppackets.begin() ; it != apppackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	for (it = unknownpackets.begin() ; it != unknownpackets.end() ; it++)
	{
		if ((*it).packetdata)
			RTPDeleteByteArray((*it).packetdata,GetMemoryManager());
	}
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	byepackets.clear();
	apppackets.clear();
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownpackets.clear();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	byesize = 0;
	appsize = 0;
#ifdef RTP_SUPPORT_RTCPUNKNOWN
	unknownsize = 0;
#endif // RTP_SUPPORT_RTCPUNKNOWN 
}